

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterStartDocument
              (xmlTextWriterPtr writer,char *version,char *encoding,char *standalone)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlLinkPtr lk_00;
  void *pvVar5;
  xmlBufPtr pxVar6;
  xmlChar *pxVar7;
  xmlCharEncodingHandlerPtr local_48;
  xmlCharEncodingHandlerPtr encoder;
  xmlLinkPtr lk;
  int sum;
  int count;
  char *standalone_local;
  char *encoding_local;
  char *version_local;
  xmlTextWriterPtr writer_local;
  
  if ((writer == (xmlTextWriterPtr)0x0) || (writer->out == (xmlOutputBufferPtr)0x0)) {
    xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,"xmlTextWriterStartDocument : invalid writer!\n");
    writer_local._4_4_ = -1;
  }
  else {
    lk_00 = xmlListFront(writer->nodes);
    if ((lk_00 == (xmlLinkPtr)0x0) || (pvVar5 = xmlLinkGetData(lk_00), pvVar5 == (void *)0x0)) {
      local_48 = (xmlCharEncodingHandlerPtr)0x0;
      if ((encoding == (char *)0x0) ||
         (local_48 = xmlFindCharEncodingHandler(encoding),
         local_48 != (xmlCharEncodingHandlerPtr)0x0)) {
        writer->out->encoder = local_48;
        if (local_48 == (xmlCharEncodingHandlerPtr)0x0) {
          writer->out->conv = (xmlBufPtr)0x0;
        }
        else {
          if (writer->out->conv == (xmlBufPtr)0x0) {
            pxVar6 = xmlBufCreateSize(4000);
            writer->out->conv = pxVar6;
          }
          xmlCharEncOutput(writer->out,1);
          if ((writer->doc != (xmlDocPtr)0x0) && (writer->doc->encoding == (xmlChar *)0x0)) {
            pxVar7 = xmlStrdup((xmlChar *)writer->out->encoder->name);
            writer->doc->encoding = pxVar7;
          }
        }
        iVar1 = xmlOutputBufferWriteString(writer->out,"<?xml version=");
        if (iVar1 < 0) {
          writer_local._4_4_ = -1;
        }
        else {
          iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
          if (iVar2 < 0) {
            writer_local._4_4_ = -1;
          }
          else {
            if (version == (char *)0x0) {
              lk._4_4_ = xmlOutputBufferWriteString(writer->out,"1.0");
            }
            else {
              lk._4_4_ = xmlOutputBufferWriteString(writer->out,version);
            }
            if (lk._4_4_ < 0) {
              writer_local._4_4_ = -1;
            }
            else {
              iVar3 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
              if (iVar3 < 0) {
                writer_local._4_4_ = -1;
              }
              else {
                lk._0_4_ = iVar3 + lk._4_4_ + iVar2 + iVar1;
                if (writer->out->encoder != (xmlCharEncodingHandlerPtr)0x0) {
                  iVar1 = xmlOutputBufferWriteString(writer->out," encoding=");
                  if (iVar1 < 0) {
                    return -1;
                  }
                  iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
                  if (iVar2 < 0) {
                    return -1;
                  }
                  iVar3 = xmlOutputBufferWriteString(writer->out,writer->out->encoder->name);
                  if (iVar3 < 0) {
                    return -1;
                  }
                  iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
                  if (iVar4 < 0) {
                    return -1;
                  }
                  lk._0_4_ = iVar4 + iVar3 + iVar2 + iVar1 + (int)lk;
                }
                if (standalone != (char *)0x0) {
                  iVar1 = xmlOutputBufferWriteString(writer->out," standalone=");
                  if (iVar1 < 0) {
                    return -1;
                  }
                  iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
                  if (iVar2 < 0) {
                    return -1;
                  }
                  iVar3 = xmlOutputBufferWriteString(writer->out,standalone);
                  if (iVar3 < 0) {
                    return -1;
                  }
                  iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
                  if (iVar4 < 0) {
                    return -1;
                  }
                  lk._0_4_ = iVar4 + iVar3 + iVar2 + iVar1 + (int)lk;
                }
                iVar1 = xmlOutputBufferWriteString(writer->out,"?>\n");
                if (iVar1 < 0) {
                  writer_local._4_4_ = -1;
                }
                else {
                  writer_local._4_4_ = iVar1 + (int)lk;
                }
              }
            }
          }
        }
      }
      else {
        xmlWriterErrMsg(writer,XML_ERR_UNSUPPORTED_ENCODING,
                        "xmlTextWriterStartDocument : unsupported encoding\n");
        writer_local._4_4_ = -1;
      }
    }
    else {
      xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                      "xmlTextWriterStartDocument : not allowed in this context!\n");
      writer_local._4_4_ = -1;
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterStartDocument(xmlTextWriterPtr writer, const char *version,
                           const char *encoding, const char *standalone)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlCharEncodingHandlerPtr encoder;

    if ((writer == NULL) || (writer->out == NULL)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartDocument : invalid writer!\n");
        return -1;
    }

    lk = xmlListFront(writer->nodes);
    if ((lk != NULL) && (xmlLinkGetData(lk) != NULL)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartDocument : not allowed in this context!\n");
        return -1;
    }

    encoder = NULL;
    if (encoding != NULL) {
        encoder = xmlFindCharEncodingHandler(encoding);
        if (encoder == NULL) {
            xmlWriterErrMsg(writer, XML_ERR_UNSUPPORTED_ENCODING,
                            "xmlTextWriterStartDocument : unsupported encoding\n");
            return -1;
        }
    }

    writer->out->encoder = encoder;
    if (encoder != NULL) {
	if (writer->out->conv == NULL) {
	    writer->out->conv = xmlBufCreateSize(4000);
	}
        xmlCharEncOutput(writer->out, 1);
        if ((writer->doc != NULL) && (writer->doc->encoding == NULL))
            writer->doc->encoding = xmlStrdup((xmlChar *)writer->out->encoder->name);
    } else
        writer->out->conv = NULL;

    sum = 0;
    count = xmlOutputBufferWriteString(writer->out, "<?xml version=");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
    if (count < 0)
        return -1;
    sum += count;
    if (version != 0)
        count = xmlOutputBufferWriteString(writer->out, version);
    else
        count = xmlOutputBufferWriteString(writer->out, "1.0");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
    if (count < 0)
        return -1;
    sum += count;
    if (writer->out->encoder != 0) {
        count = xmlOutputBufferWriteString(writer->out, " encoding=");
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
        count =
            xmlOutputBufferWriteString(writer->out,
                                       writer->out->encoder->name);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (standalone != 0) {
        count = xmlOutputBufferWriteString(writer->out, " standalone=");
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWriteString(writer->out, standalone);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "?>\n");
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}